

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_internal.h
# Opt level: O0

vector<int,_std::allocator<int>_> *
ASDCP::version_split(vector<int,_std::allocator<int>_> *__return_storage_ptr__,char *str)

{
  long lVar1;
  size_t sVar2;
  size_type sVar3;
  value_type_conflict1 local_48 [5];
  value_type_conflict1 local_34;
  char *local_30;
  char *r;
  char *pstr;
  char *local_18;
  char *str_local;
  vector<int,_std::allocator<int>_> *result;
  
  pstr._7_1_ = 0;
  local_18 = str;
  str_local = (char *)__return_storage_ptr__;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  r = local_18;
  local_30 = strchr(local_18,0x2e);
  while (local_30 != (char *)0x0) {
    if (local_30 < r) {
      __assert_fail("r >= pstr",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_internal.h"
                    ,0x4c,"std::vector<int> ASDCP::version_split(const char *)");
    }
    if (r < local_30) {
      lVar1 = strtol(r,(char **)0x0,10);
      local_34 = (value_type_conflict1)lVar1;
      std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&local_34);
    }
    r = local_30 + 1;
    local_30 = strchr(r,0x2e);
  }
  sVar2 = strlen(r);
  if (sVar2 != 0) {
    lVar1 = strtol(r,(char **)0x0,10);
    local_48[0] = (value_type_conflict1)lVar1;
    std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,local_48);
  }
  sVar3 = std::vector<int,_std::allocator<int>_>::size(__return_storage_ptr__);
  if (sVar3 != 3) {
    __assert_fail("result.size() == 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_internal.h"
                  ,0x57,"std::vector<int> ASDCP::version_split(const char *)");
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<int>
    version_split(const char* str)
  {
    std::vector<int> result;
    const char* pstr = str;
    const char* r = strchr(pstr, '.');

    while ( r != 0 )
      {
	assert(r >= pstr);
	if ( r > pstr )
	  result.push_back(strtol(pstr, 0, 10));

	pstr = r + 1;
	r = strchr(pstr, '.');
      }

    if( strlen(pstr) > 0 )
      result.push_back(strtol(pstr, 0, 10));

    assert(result.size() == 3);
    return result;
  }